

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_mask_sse4.h
# Opt level: O0

void aom_lowbd_blend_a64_d16_mask_subw0_subh0_w8_sse4_1
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               __m128i *round_offset,int shift)

{
  undefined1 auVar1 [16];
  uint in_ECX;
  __m128i *in_RDX;
  uint in_ESI;
  CONV_BUF_TYPE *in_RDI;
  uint8_t *dst_00;
  undefined1 auVar2 [64];
  void *in_stack_00000008;
  __m128i m;
  __m128i m0;
  int i;
  __m128i v_maxval;
  int in_stack_00000190;
  int local_8c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined6 in_stack_ffffffffffffffc0;
  undefined2 uVar3;
  
  uVar3 = 0x40;
  auVar1 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar1 = vpinsrw_avx(auVar1,0x40,2);
  auVar1 = vpinsrw_avx(auVar1,0x40,3);
  auVar1 = vpinsrw_avx(auVar1,0x40,4);
  auVar1 = vpinsrw_avx(auVar1,0x40,5);
  auVar1 = vpinsrw_avx(auVar1,0x40,6);
  auVar1 = vpinsrw_avx(auVar1,0x40,7);
  auVar2 = ZEXT1664(auVar1);
  for (local_8c = 0; dst_00 = auVar2._0_8_, local_8c < (int)m[1]; local_8c = local_8c + 1) {
    xx_loadl_64(in_stack_00000008);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dst_00;
    auVar1 = vpmovzxbw_avx(auVar1);
    auVar2 = ZEXT1664(auVar1);
    blend_a64_d16_mask_w8_sse41
              (dst_00,(CONV_BUF_TYPE *)CONCAT26(uVar3,in_stack_ffffffffffffffc0),in_RDI,
               (__m128i *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),in_RDX,
               (__m128i *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0),in_stack_00000190);
    in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)(uint)m[0]);
    in_RDI = (CONV_BUF_TYPE *)((long)in_RDI + (ulong)in_ESI);
    in_RDX = (__m128i *)((long)*in_RDX + (ulong)in_ECX * 2);
  }
  return;
}

Assistant:

static inline void aom_lowbd_blend_a64_d16_mask_subw0_subh0_w8_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h,
    const __m128i *round_offset, int shift) {
  const __m128i v_maxval = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  for (int i = 0; i < h; ++i) {
    const __m128i m0 = xx_loadl_64(mask);
    const __m128i m = _mm_cvtepu8_epi16(m0);
    blend_a64_d16_mask_w8_sse41(dst, src0, src1, &m, round_offset, &v_maxval,
                                shift);
    mask += mask_stride;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}